

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

CESkyCoord * __thiscall
CESkyCoord::ConvertToObserved
          (CESkyCoord *__return_storage_ptr__,CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CESkyCoord(__return_storage_ptr__);
  switch(this->coord_type_) {
  case CIRS:
    CIRS2Observed(this,__return_storage_ptr__,date,observer,(CESkyCoord *)0x0,(CEAngle *)0x0);
    break;
  case ICRS:
    ICRS2Observed(this,__return_storage_ptr__,date,observer,(CESkyCoord *)0x0,(CEAngle *)0x0);
    break;
  case GALACTIC:
    Galactic2Observed(this,__return_storage_ptr__,date,observer,(CESkyCoord *)0x0,(CEAngle *)0x0);
    break;
  case OBSERVED:
    SetCoordinates(__return_storage_ptr__,this);
    break;
  case ECLIPTIC:
    Ecliptic2Observed(this,__return_storage_ptr__,date,observer);
  }
  return __return_storage_ptr__;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToObserved(const CEDate&     date,
                                         const CEObserver& observer)
{
    // Create return coordinates
    CESkyCoord observed;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> OBSERVED
        CIRS2Observed(*this, &observed, date, observer);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> OBSERVED
        ICRS2Observed(*this, &observed, date, observer);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> OBSERVED
        Galactic2Observed(*this, &observed, date, observer);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> OBSERVED
        observed.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> OBSERVED
        Ecliptic2Observed(*this, &observed, date, observer);
    }
    
    return observed;
}